

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

image<crnlib::color_quad<unsigned_char,_int>_> * __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::operator=
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,
          image<crnlib::color_quad<unsigned_char,_int>_> *other)

{
  bool bVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  uint total_pixels;
  image<crnlib::color_quad<unsigned_char,_int>_> *other_local;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  if (this != other) {
    bVar1 = vector<crnlib::color_quad<unsigned_char,_int>_>::empty(&other->m_pixel_buf);
    if (bVar1) {
      uVar2 = other->m_pitch * other->m_height;
      if ((uVar2 == 0) || (other->m_pPixels == (color_quad<unsigned_char,_int> *)0x0)) {
        vector<crnlib::color_quad<unsigned_char,_int>_>::clear(&this->m_pixel_buf);
        this->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
      }
      else {
        vector<crnlib::color_quad<unsigned_char,_int>_>::resize(&this->m_pixel_buf,uVar2,false);
        pcVar3 = other->m_pPixels;
        uVar2 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&this->m_pixel_buf);
        vector<crnlib::color_quad<unsigned_char,_int>_>::insert(&this->m_pixel_buf,0,pcVar3,uVar2);
        pcVar3 = vector<crnlib::color_quad<unsigned_char,_int>_>::front(&this->m_pixel_buf);
        this->m_pPixels = pcVar3;
      }
    }
    else {
      vector<crnlib::color_quad<unsigned_char,_int>_>::operator=
                (&this->m_pixel_buf,&other->m_pixel_buf);
      pcVar3 = vector<crnlib::color_quad<unsigned_char,_int>_>::front(&this->m_pixel_buf);
      this->m_pPixels = pcVar3;
    }
    this->m_width = other->m_width;
    this->m_height = other->m_height;
    this->m_pitch = other->m_pitch;
    this->m_total = other->m_total;
    this->m_comp_flags = other->m_comp_flags;
  }
  return this;
}

Assistant:

image& operator=(const image& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (other.m_pixel_buf.empty())
            {
                // This doesn't look very safe - let's make a new instance.
                //m_pixel_buf.clear();
                //m_pPixels = other.m_pPixels;

                const uint total_pixels = other.m_pitch * other.m_height;
                if ((total_pixels) && (other.m_pPixels))
                {
                    m_pixel_buf.resize(total_pixels);
                    m_pixel_buf.insert(0, other.m_pPixels, m_pixel_buf.size());
                    m_pPixels = &m_pixel_buf.front();
                }
                else
                {
                    m_pixel_buf.clear();
                    m_pPixels = nullptr;
                }
            }
            else
            {
                m_pixel_buf = other.m_pixel_buf;
                m_pPixels = &m_pixel_buf.front();
            }

            m_width = other.m_width;
            m_height = other.m_height;
            m_pitch = other.m_pitch;
            m_total = other.m_total;
            m_comp_flags = other.m_comp_flags;

            return *this;
        }